

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::GetToolset
          (cmGlobalGhsMultiGenerator *this,cmMakefile *mf,string *tsp,string *ts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  string *psVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *puVar8;
  string tryPath;
  string msg;
  string root;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"GHS_TOOLSET_ROOT","");
  psVar5 = cmMakefile::GetSafeDefinition(mf,&local_a8);
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + psVar5->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (ts->_M_string_length == 0) {
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity = 0;
    bVar4 = cmsys::SystemTools::PathExists(&local_68);
    if (bVar4) {
      if (local_68._M_dataplus._M_p[local_68._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)&local_68);
      }
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"comp_[^;]+","");
      cmSystemTools::Glob(&local_68,&local_a8,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_48._M_dataplus._M_p == (pointer)local_48._M_string_length) {
        std::operator+(&local_88,"No GHS toolsets found in GHS_TOOLSET_ROOT \"",&local_68);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
        puVar8 = (ulong *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar8) {
          local_a8.field_2._M_allocated_capacity = *puVar8;
          local_a8.field_2._8_8_ = plVar6[3];
          local_a8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *puVar8;
          local_a8._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_a8._M_string_length = plVar6[1];
        *plVar6 = (long)puVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_a8);
        std::__cxx11::string::_M_replace((ulong)tsp,0,(char *)tsp->_M_string_length,0x6e77f9);
      }
      else {
        std::operator+(&local_a8,&local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_48._M_string_length + -0x20));
        std::__cxx11::string::operator=((string *)tsp,(string *)&local_a8);
      }
    }
    else {
      std::operator+(&local_88,"GHS_TOOLSET_ROOT directory \"",&local_68);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
      puVar8 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_a8.field_2._M_allocated_capacity = *puVar8;
        local_a8.field_2._8_8_ = plVar6[3];
        local_a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_a8.field_2._M_allocated_capacity = *puVar8;
        local_a8._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_a8._M_string_length = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_a8);
      std::__cxx11::string::_M_replace((ulong)tsp,0,(char *)tsp->_M_string_length,0x6e77f9);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
  }
  else {
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity =
         local_a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    cmsys::SystemTools::CollapseFullPath(&local_88,ts,&local_68);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
    paVar2 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    bVar4 = cmsys::SystemTools::FileExists(&local_a8);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)tsp);
    }
    else {
      std::operator+(&local_48,"GHS toolset \"",&local_a8);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_48);
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_88.field_2._M_allocated_capacity = *psVar7;
        local_88.field_2._8_8_ = plVar6[3];
        local_88._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar7;
        local_88._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_88._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_88);
      std::__cxx11::string::_M_replace((ulong)tsp,0,(char *)tsp->_M_string_length,0x6e77f9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::GetToolset(cmMakefile* mf, std::string& tsp,
                                           const std::string& ts)
{
  /* Determine tsp - full path of the toolset from ts (toolset hint via -T) */

  std::string root = mf->GetSafeDefinition("GHS_TOOLSET_ROOT");

  // Check if `-T` was set by user
  if (ts.empty()) {
    // Enter toolset search mode
    std::vector<std::string> output;

    // Make sure root exists...
    if (!cmSystemTools::PathExists(root)) {
      std::string msg =
        "GHS_TOOLSET_ROOT directory \"" + root + "\" does not exist.";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
      return;
    }

    // Add a directory separator
    if (root.back() != '/') {
      root += "/";
    }

    // Get all compiler directories in toolset root
    cmSystemTools::Glob(root, "comp_[^;]+", output);

    if (output.empty()) {
      // No compiler directories found
      std::string msg =
        "No GHS toolsets found in GHS_TOOLSET_ROOT \"" + root + "\".";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
    } else {
      // Use latest? version
      tsp = root + output.back();
    }

  } else {
    // Toolset was provided by user
    std::string tryPath;

    // NOTE: CollapseFullPath() will determine if user toolset was full path or
    //       or relative path.
    tryPath = cmSystemTools::CollapseFullPath(ts, root);
    if (!cmSystemTools::FileExists(tryPath)) {
      std::string msg = "GHS toolset \"" + tryPath + "\" does not exist.";
      mf->IssueMessage(MessageType::FATAL_ERROR, msg);
      tsp = "";
    } else {
      tsp = tryPath;
    }
  }
}